

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

boolean jpeg_resync_to_restart(j_decompress_ptr cinfo,int desired)

{
  jpeg_error_mgr *pjVar1;
  boolean bVar2;
  uint uVar3;
  
  uVar3 = cinfo->unread_marker;
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x79;
  (pjVar1->msg_parm).i[0] = uVar3;
  (cinfo->err->msg_parm).i[1] = desired;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
  do {
    if (0xbf < (int)uVar3) {
      if (((uVar3 - 0xd8 < 0xfffffff8) || (uVar3 == (desired + 1U & 7 | 0xd0))) ||
         (uVar3 == (desired + 2U & 7 | 0xd0))) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 0x61;
        (pjVar1->msg_parm).i[0] = uVar3;
        (cinfo->err->msg_parm).i[1] = 3;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,4);
        return 1;
      }
      if ((uVar3 != (desired - 1U & 7 | 0xd0)) && (uVar3 != (desired + 6U & 7 | 0xd0))) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 0x61;
        (pjVar1->msg_parm).i[0] = uVar3;
        (cinfo->err->msg_parm).i[1] = 1;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,4);
        cinfo->unread_marker = 0;
        return 1;
      }
    }
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x61;
    (pjVar1->msg_parm).i[0] = uVar3;
    (cinfo->err->msg_parm).i[1] = 2;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,4);
    bVar2 = next_marker(cinfo);
    if (bVar2 == 0) {
      return 0;
    }
    uVar3 = cinfo->unread_marker;
  } while( true );
}

Assistant:

GLOBAL(boolean)
jpeg_resync_to_restart(j_decompress_ptr cinfo, int desired)
{
  int marker = cinfo->unread_marker;
  int action = 1;

  /* Always put up a warning. */
  WARNMS2(cinfo, JWRN_MUST_RESYNC, marker, desired);

  /* Outer loop handles repeated decision after scanning forward. */
  for (;;) {
    if (marker < (int)M_SOF0)
      action = 2;               /* invalid marker */
    else if (marker < (int)M_RST0 || marker > (int)M_RST7)
      action = 3;               /* valid non-restart marker */
    else {
      if (marker == ((int)M_RST0 + ((desired + 1) & 7)) ||
          marker == ((int)M_RST0 + ((desired + 2) & 7)))
        action = 3;             /* one of the next two expected restarts */
      else if (marker == ((int)M_RST0 + ((desired - 1) & 7)) ||
               marker == ((int)M_RST0 + ((desired - 2) & 7)))
        action = 2;             /* a prior restart, so advance */
      else
        action = 1;             /* desired restart or too far away */
    }
    TRACEMS2(cinfo, 4, JTRC_RECOVERY_ACTION, marker, action);
    switch (action) {
    case 1:
      /* Discard marker and let entropy decoder resume processing. */
      cinfo->unread_marker = 0;
      return TRUE;
    case 2:
      /* Scan to the next marker, and repeat the decision loop. */
      if (!next_marker(cinfo))
        return FALSE;
      marker = cinfo->unread_marker;
      break;
    case 3:
      /* Return without advancing past this marker. */
      /* Entropy decoder will be forced to process an empty segment. */
      return TRUE;
    }
  } /* end loop */
}